

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum.hpp
# Opt level: O2

void __thiscall
ranges::
partial_sum_view<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_std::plus<void>_>
::cursor<false>::next(cursor<false> *this)

{
  iterator_t<Base> *this_00;
  bool bVar1;
  int *piVar2;
  anon_union_8_2_3194c211_for_type_0 __nbytes;
  void *__buf;
  int __fd;
  _result_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_&>
  last;
  
  __fd = (int)&last;
  last.
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.rng_ = &this->parent_->base_;
  __nbytes = (anon_union_8_2_3194c211_for_type_0)
             ((this->parent_->base_).rngs_.
              super__Tuple_impl<0UL,_ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>
              .super__Tuple_impl<1UL,_ranges::ref_view<std::array<int,_12UL>_>_>.
              super__Head_base<1UL,_ranges::ref_view<std::array<int,_12UL>_>,_false>._M_head_impl.
              rng_ + 1);
  last.
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.index_ = 1;
  this_00 = &this->current_;
  last.
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.super_variant_data<int_*,_int_*>.field_0 = __nbytes;
  bVar1 = operator!=<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                    (this_00,&last);
  if (bVar1) {
    concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>
    ::next((cursor<false> *)this_00);
    bVar1 = operator!=<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                      (this_00,&last);
    if (bVar1) {
      piVar2 = (int *)concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>
                      ::cursor<false>::read((cursor<false> *)this_00,__fd,__buf,(size_t)__nbytes);
      this->sum_ = this->sum_ + *piVar2;
    }
    return;
  }
  __assert_fail("current_ != last",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/partial_sum.hpp"
                ,0x79,
                "void ranges::partial_sum_view<ranges::concat_view<ranges::single_view<int>, ranges::ref_view<std::array<int, 12>>>, std::plus<void>>::cursor<false>::next() [Rng = ranges::concat_view<ranges::single_view<int>, ranges::ref_view<std::array<int, 12>>>, Fun = std::plus<void>, IsConst = false]"
               );
}

Assistant:

constexpr void next()
            {
                auto last = ranges::end(parent_->base_);
                RANGES_EXPECT(current_ != last);
                if(++current_ != last)
                {
                    auto & sum = static_cast<range_value_t<Rng> &>(sum_);
                    using F = meta::const_if_c<IsConst, Fun>;
                    auto & f = static_cast<F &>(parent_->fun_);
                    sum = invoke(f, sum, *current_);
                }
            }